

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCentroidWeight
          (VClient *this,string *i_rCameraName,uint i_CentroidIndex,double *o_rWeight)

{
  pointer pfVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  VCentroidWeights *pVVar4;
  Enum EVar5;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_34;
  unique_lock<boost::recursive_mutex> local_30;
  
  local_30.m = &this->m_FrameMutex;
  local_30.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_30);
  local_34 = Success;
  ClientUtils::Clear(o_rWeight);
  bVar2 = InitGet(this,&local_34);
  if (bVar2) {
    pVVar3 = GetCamera(this,i_rCameraName,&local_34);
    if (pVVar3 == (VCameraInfo *)0x0) {
      o_rWeight = (double *)(ulong)local_34;
    }
    else {
      pVVar4 = GetCentroidWeightSet(this,pVVar3->m_CameraID,&local_34);
      if (pVVar4 != (VCentroidWeights *)0x0) {
        pfVar1 = (pVVar4->m_Weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)i_CentroidIndex <
            (ulong)((long)(pVVar4->m_Weights).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 2)) {
          *o_rWeight = (double)pfVar1[i_CentroidIndex];
        }
        else {
          local_34 = InvalidIndex;
        }
      }
    }
    EVar5 = (Enum)o_rWeight;
    if (pVVar3 == (VCameraInfo *)0x0) goto LAB_001304e8;
  }
  EVar5 = local_34;
LAB_001304e8:
  if (local_30.is_locked == true) {
    boost::recursive_mutex::unlock(local_30.m);
  }
  return EVar5;
}

Assistant:

Result::Enum VClient::GetCentroidWeight( const std::string & i_rCameraName,
  const unsigned int i_CentroidIndex,
  double & o_rWeight ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rWeight ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    const ViconCGStream::VCentroidWeights* pCentroidWeightSet = GetCentroidWeightSet( pCamera->m_CameraID, GetResult );
    if( pCentroidWeightSet )
    {
      if( i_CentroidIndex < pCentroidWeightSet->m_Weights.size() )
      {
        o_rWeight = pCentroidWeightSet->m_Weights[i_CentroidIndex];;
      }
      else
      {
        GetResult = Result::InvalidIndex;
      }
    }
  }
  return GetResult;
}